

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_create_response_string(void)

{
  int iVar1;
  char local_5268 [8];
  char data [1000];
  undefined2 local_4e78 [4];
  undefined1 auStack_4e70 [32];
  undefined1 auStack_4e50 [10000];
  undefined1 local_2740 [8];
  HttpResponse resp;
  
  local_4e78[0] = 200;
  memset(auStack_4e70,0,0x20);
  memcpy(auStack_4e50,"<html><h1>Kek</h1></html>",10000);
  memcpy(local_2740,local_4e78,0x2738);
  memset(&resp,0,0x20);
  resp.headers.ref = (char **)anon_var_dwarf_1b6f;
  map_set_((map_base_t *)&resp,"access-control-expose-headers",&resp.headers.ref,8);
  resp.headers.ref = (char **)anon_var_dwarf_1956;
  map_set_((map_base_t *)&resp,"cache-control",&resp.headers.ref,8);
  resp.headers.ref = (char **)anon_var_dwarf_1b83;
  map_set_((map_base_t *)&resp,"content-encoding",&resp.headers.ref,8);
  resp.headers.ref = (char **)anon_var_dwarf_1b97;
  map_set_((map_base_t *)&resp,"content-type",&resp.headers.ref,8);
  parse_resp_to_str((HttpResponse *)local_2740,local_5268);
  iVar1 = strcmp(local_5268,TEST_RESP1);
  test_check_((uint)(iVar1 == 0),
              "/workspace/llm4binary/github/license_all_cmakelists_1510/RedMoon32[P]ShabeFramework/tests/tests.c"
              ,0x5f,"%s","strcmp(data, TEST_RESP1) == 0");
  test_message_("Expected: %s\n\n",TEST_RESP1);
  test_message_("Produced: %s\n\n",local_5268);
  map_deinit_((map_base_t *)&resp);
  return;
}

Assistant:

void test_create_response_string(void) {

    HttpResponse resp;
    resp = (HttpResponse) {.status_code = 200, .data = "<html><h1>Kek</h1></html>"};
    map_init(&resp.headers);
    map_set(&resp.headers, "access-control-expose-headers", "X-Frontend");
    map_set(&resp.headers, "cache-control", "no-store");
    map_set(&resp.headers, "content-encoding", "gzip");
    map_set(&resp.headers, "content-type", "text/html; charset=windows-1251");
    char data[MAX_REQUEST_LENGTH];
    parse_resp_to_str(&resp, data);
    TEST_CHECK(strcmp(data, TEST_RESP1) == 0);
    TEST_MSG("Expected: %s\n\n", TEST_RESP1);
    TEST_MSG("Produced: %s\n\n", data);

    map_deinit(&resp.headers);
}